

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EmptyStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EmptyStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2)

{
  Token semicolon;
  EmptyStatementSyntax *pEVar1;
  EmptyStatementSyntax *in_RCX;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  
  pEVar1 = (EmptyStatementSyntax *)allocate(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  semicolon.info = in_RSI;
  semicolon._0_8_ = in_RDX;
  slang::syntax::EmptyStatementSyntax::EmptyStatementSyntax
            (in_RCX,(NamedLabelSyntax *)(in_RCX->super_StatementSyntax).super_SyntaxNode.parent,
             *(SyntaxList<slang::syntax::AttributeInstanceSyntax> **)
              &(in_RCX->super_StatementSyntax).super_SyntaxNode,semicolon);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }